

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::UnaryFunctionLayerParams::ByteSizeLong(UnaryFunctionLayerParams *this)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  size_t sVar3;
  undefined4 in_EDX;
  undefined4 extraout_EDX;
  uint uVar4;
  
  if (this->type_ == 0) {
    sVar2 = 0;
  }
  else {
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->type_);
    sVar2 = sVar2 + 1;
    in_EDX = extraout_EDX;
  }
  auVar1._4_4_ = -(uint)(this->epsilon_ != 0.0);
  auVar1._0_4_ = -(uint)(this->alpha_ != 0.0);
  auVar1._8_4_ = -(uint)(this->shift_ != 0.0);
  auVar1._12_4_ = -(uint)(this->scale_ != 0.0);
  uVar4 = movmskps(in_EDX,auVar1);
  sVar3 = sVar2 + 5;
  if ((uVar4 & 1) == 0) {
    sVar3 = sVar2;
  }
  sVar2 = sVar3 + 5;
  if ((uVar4 & 2) == 0) {
    sVar2 = sVar3;
  }
  sVar3 = sVar2 + 5;
  if ((uVar4 & 4) == 0) {
    sVar3 = sVar2;
  }
  sVar2 = sVar3 + 5;
  if ((uVar4 & 8) == 0) {
    sVar2 = sVar3;
  }
  this->_cached_size_ = (int)sVar2;
  return sVar2;
}

Assistant:

size_t UnaryFunctionLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.UnaryFunctionLayerParams)
  size_t total_size = 0;

  // .CoreML.Specification.UnaryFunctionLayerParams.Operation type = 1;
  if (this->type() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->type());
  }

  // float alpha = 2;
  if (this->alpha() != 0) {
    total_size += 1 + 4;
  }

  // float epsilon = 3;
  if (this->epsilon() != 0) {
    total_size += 1 + 4;
  }

  // float shift = 4;
  if (this->shift() != 0) {
    total_size += 1 + 4;
  }

  // float scale = 5;
  if (this->scale() != 0) {
    total_size += 1 + 4;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}